

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

string * string_printf_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  char *pcVar1;
  char in_AL;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char str [1000];
  undefined8 local_4d8;
  void **local_4d0;
  undefined1 *local_4c8;
  undefined1 local_4b8 [16];
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  undefined8 local_418;
  char local_408 [1000];
  
  local_4c8 = local_4b8;
  if (in_AL != '\0') {
    local_488 = in_XMM0_Qa;
    local_478 = in_XMM1_Qa;
    local_468 = in_XMM2_Qa;
    local_458 = in_XMM3_Qa;
    local_448 = in_XMM4_Qa;
    local_438 = in_XMM5_Qa;
    local_428 = in_XMM6_Qa;
    local_418 = in_XMM7_Qa;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_4d0 = &args[0].overflow_arg_area;
  local_4d8 = 0x3000000010;
  local_4a8 = in_RDX;
  local_4a0 = in_RCX;
  local_498 = in_R8;
  local_490 = in_R9;
  iVar2 = vsnprintf(local_408,1000,format,&local_4d8);
  if (-1 < iVar2) {
    pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
    strlen(local_408);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)local_408);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string
string_printf (const char *format, ...)
{
  std::string result;
  char str[1000];
  va_list args;
  va_start (args, format);
  if (vsnprintf (str, sizeof str, format, args) >= 0)
    result = str;
  va_end (args);
  return result;
}